

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references.cc
# Opt level: O2

void __thiscall
brotli::ZopfliCostModel::SetFromLiteralCosts
          (ZopfliCostModel *this,size_t num_bytes,size_t position,uint8_t *ringbuffer,
          size_t ringbuffer_mask)

{
  pointer pdVar1;
  size_t sVar2;
  long lVar3;
  double dVar4;
  vector<float,_std::allocator<float>_> literal_cost;
  allocator_type local_51;
  size_t local_50;
  _Vector_base<float,_std::allocator<float>_> local_48;
  
  local_50 = ringbuffer_mask;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&local_48,num_bytes + 1,&local_51);
  EstimateBitCostsForLiterals
            (position,num_bytes,local_50,ringbuffer,
             local_48._M_impl.super__Vector_impl_data._M_start);
  std::vector<double,_std::allocator<double>_>::resize(&this->literal_costs_,num_bytes + 1);
  pdVar1 = (this->literal_costs_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  *pdVar1 = 0.0;
  dVar4 = 0.0;
  for (sVar2 = 0; num_bytes != sVar2; sVar2 = sVar2 + 1) {
    dVar4 = dVar4 + (double)local_48._M_impl.super__Vector_impl_data._M_start[sVar2];
    pdVar1[sVar2 + 1] = dVar4;
  }
  std::vector<double,_std::allocator<double>_>::resize(&this->cost_cmd_,0x2c0);
  std::vector<double,_std::allocator<double>_>::resize(&this->cost_dist_,0x208);
  for (lVar3 = 0; lVar3 != 0x2c0; lVar3 = lVar3 + 1) {
    dVar4 = FastLog2(lVar3 + 0xb);
    (this->cost_cmd_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[lVar3] = dVar4;
  }
  for (lVar3 = 0; lVar3 != 0x208; lVar3 = lVar3 + 1) {
    dVar4 = FastLog2(lVar3 + 0x14);
    (this->cost_dist_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[lVar3] = dVar4;
  }
  this->min_cost_cmd_ = 3.4594316482543945;
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_48);
  return;
}

Assistant:

void SetFromLiteralCosts(size_t num_bytes,
                           size_t position,
                           const uint8_t* ringbuffer,
                           size_t ringbuffer_mask) {
    std::vector<float> literal_cost(num_bytes + 1);
    EstimateBitCostsForLiterals(position, num_bytes, ringbuffer_mask,
                                ringbuffer, &literal_cost[0]);
    literal_costs_.resize(num_bytes + 1);
    literal_costs_[0] = 0.0;
    for (size_t i = 0; i < num_bytes; ++i) {
      literal_costs_[i + 1] = literal_costs_[i] + literal_cost[i];
    }
    cost_cmd_.resize(kNumCommandPrefixes);
    cost_dist_.resize(kNumDistancePrefixes);
    for (uint32_t i = 0; i < kNumCommandPrefixes; ++i) {
      cost_cmd_[i] = FastLog2(11 + i);
    }
    for (uint32_t i = 0; i < kNumDistancePrefixes; ++i) {
      cost_dist_[i] = FastLog2(20 + i);
    }
    min_cost_cmd_ = FastLog2(11);
  }